

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removeRowSingleton
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *row,int *i)

{
  double a;
  bool bVar1;
  int _j;
  int iVar2;
  int iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  int iVar6;
  undefined4 uVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  pointer pnVar9;
  undefined8 uVar10;
  int *piVar11;
  char cVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  bool bVar15;
  int iVar16;
  RowSingletonPS *this_00;
  long lVar17;
  long lVar18;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar19;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  *psVar20;
  cpp_dec_float<200U,_int,_void> *pcVar21;
  undefined8 *puVar22;
  undefined4 *puVar23;
  pointer pnVar24;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar25;
  pointer pnVar26;
  uint *puVar27;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar28;
  uint *puVar29;
  bool bVar30;
  long in_FS_OFFSET;
  byte bVar31;
  double a_00;
  bool local_1180;
  fpclass_type local_1178;
  shared_ptr<soplex::Tolerances> local_1138;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  fpclass_type local_10b0;
  cpp_dec_float<200U,_int,_void> local_1098;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined5 uStack_fb0;
  undefined3 uStack_fab;
  int iStack_fa8;
  char cStack_fa4;
  undefined8 local_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined5 uStack_f30;
  undefined3 uStack_f2b;
  int iStack_f28;
  char cStack_f24;
  undefined8 local_f20;
  cpp_dec_float<200U,_int,_void> local_f18;
  cpp_dec_float<200U,_int,_void> local_e98;
  cpp_dec_float<200U,_int,_void> local_e18;
  cpp_dec_float<200U,_int,_void> local_d98;
  cpp_dec_float<200U,_int,_void> local_d18;
  cpp_dec_float<200U,_int,_void> local_c98;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  uint local_b98 [28];
  uint local_b28 [28];
  uint local_ab8 [28];
  uint local_a48 [28];
  uint local_9d8 [28];
  uint local_968 [28];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8f8;
  undefined4 local_878 [28];
  undefined4 local_808 [28];
  uint local_798 [28];
  uint local_728 [28];
  cpp_dec_float<200U,_int,_void> local_6b8;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined5 uStack_5d0;
  undefined3 uStack_5cb;
  undefined5 uStack_5c8;
  undefined8 local_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined5 uStack_550;
  undefined3 uStack_54b;
  undefined5 uStack_548;
  undefined8 local_540;
  cpp_dec_float<200U,_int,_void> local_538;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar31 = 0;
  pNVar8 = row->m_elem;
  pNVar19 = pNVar8;
  pcVar21 = &local_f18;
  for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
    (pcVar21->data)._M_elems[0] = (pNVar19->val).m_backend.data._M_elems[0];
    pNVar19 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pNVar19->val).m_backend.data._M_elems + 1);
    pcVar21 = (cpp_dec_float<200U,_int,_void> *)((pcVar21->data)._M_elems + 1);
  }
  local_f18.exp = (pNVar8->val).m_backend.exp;
  local_f18.neg = (pNVar8->val).m_backend.neg;
  local_f18.fpclass = (pNVar8->val).m_backend.fpclass;
  local_f18.prec_elem = (pNVar8->val).m_backend.prec_elem;
  _j = pNVar8->idx;
  lVar17 = (long)_j;
  ::soplex::infinity::__tls_init();
  a = *(double *)(in_FS_OFFSET + -8);
  a_00 = -a;
  local_f20._0_4_ = cpp_dec_float_finite;
  local_f20._4_4_ = 0x1c;
  local_f98 = 0;
  uStack_f90 = 0;
  local_f88 = 0;
  uStack_f80 = 0;
  local_f78 = 0;
  uStack_f70 = 0;
  local_f68 = 0;
  uStack_f60 = 0;
  local_f58 = 0;
  uStack_f50 = 0;
  local_f48 = 0;
  uStack_f40 = 0;
  local_f38 = 0;
  uStack_f30 = 0;
  uStack_f2b = 0;
  iStack_f28 = 0;
  cStack_f24 = '\0';
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_f98,a_00);
  ::soplex::infinity::__tls_init();
  local_fa0._0_4_ = cpp_dec_float_finite;
  local_fa0._4_4_ = 0x1c;
  local_1018 = 0;
  uStack_1010 = 0;
  local_1008 = 0;
  uStack_1000 = 0;
  local_ff8 = 0;
  uStack_ff0 = 0;
  local_fe8 = 0;
  uStack_fe0 = 0;
  local_fd8 = 0;
  uStack_fd0 = 0;
  local_fc8 = 0;
  uStack_fc0 = 0;
  local_fb8 = 0;
  uStack_fb0 = 0;
  uStack_fab = 0;
  iStack_fa8 = 0;
  cStack_fa4 = '\0';
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_1018,a);
  uVar13 = local_f18._120_8_;
  pcVar21 = &local_f18;
  puVar27 = local_728;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    *puVar27 = (pcVar21->data)._M_elems[0];
    pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + ((ulong)bVar31 * -2 + 1) * 4);
    puVar27 = puVar27 + (ulong)bVar31 * -2 + 1;
  }
  local_538.fpclass = cpp_dec_float_finite;
  local_538.prec_elem = 0x1c;
  local_538.data._M_elems[0] = 0;
  local_538.data._M_elems[1] = 0;
  local_538.data._M_elems[2] = 0;
  local_538.data._M_elems[3] = 0;
  local_538.data._M_elems[4] = 0;
  local_538.data._M_elems[5] = 0;
  local_538.data._M_elems[6] = 0;
  local_538.data._M_elems[7] = 0;
  local_538.data._M_elems[8] = 0;
  local_538.data._M_elems[9] = 0;
  local_538.data._M_elems[10] = 0;
  local_538.data._M_elems[0xb] = 0;
  local_538.data._M_elems[0xc] = 0;
  local_538.data._M_elems[0xd] = 0;
  local_538.data._M_elems[0xe] = 0;
  local_538.data._M_elems[0xf] = 0;
  local_538.data._M_elems[0x10] = 0;
  local_538.data._M_elems[0x11] = 0;
  local_538.data._M_elems[0x12] = 0;
  local_538.data._M_elems[0x13] = 0;
  local_538.data._M_elems[0x14] = 0;
  local_538.data._M_elems[0x15] = 0;
  local_538.data._M_elems[0x16] = 0;
  local_538.data._M_elems[0x17] = 0;
  local_538.data._M_elems[0x18] = 0;
  local_538.data._M_elems[0x19] = 0;
  local_538.data._M_elems._104_5_ = 0;
  local_538.data._M_elems[0x1b]._1_3_ = 0;
  local_538.exp = 0;
  local_538.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_538,0.0);
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_c98,this);
  puVar27 = local_728;
  pcVar21 = (cpp_dec_float<200U,_int,_void> *)&ptr;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    (pcVar21->data)._M_elems[0] = *puVar27;
    puVar27 = puVar27 + (ulong)bVar31 * -2 + 1;
    pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar31 * -8 + 4);
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_538);
  local_10b0 = (fpclass_type)uVar13;
  if (((local_10b0 == cpp_dec_float_NaN) || (local_c98.fpclass == cpp_dec_float_NaN)) ||
     (iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_c98), iVar16 < 1)) {
    pcVar21 = &local_f18;
    pnVar25 = &local_b0;
    for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
      (pnVar25->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
      pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + ((ulong)bVar31 * -2 + 1) * 4);
      pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar25 + ((ulong)bVar31 * -2 + 1) * 4);
    }
    local_b0.m_backend.exp = local_f18.exp;
    local_b0.m_backend.neg = local_f18.neg;
    local_b0.m_backend.fpclass = local_f18.fpclass;
    local_b0.m_backend.prec_elem = local_f18.prec_elem;
    local_540 = 0x1c00000000;
    local_5b8 = 0;
    uStack_5b0 = 0;
    local_5a8 = 0;
    uStack_5a0 = 0;
    local_598 = 0;
    uStack_590 = 0;
    local_588 = 0;
    uStack_580 = 0;
    local_578 = 0;
    uStack_570 = 0;
    local_568 = 0;
    uStack_560 = 0;
    local_558 = 0;
    uStack_550 = 0;
    uStack_54b = 0;
    uStack_548 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_5b8,0.0);
    epsZero(&local_130,this);
    bVar15 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_b0,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_5b8,&local_130);
    if (!bVar15) {
      iVar16 = *i;
      pnVar9 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar24 = pnVar9 + iVar16;
      pnVar25 = &local_1b0;
      for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
        (pnVar25->m_backend).data._M_elems[0] = (pnVar24->m_backend).data._M_elems[0];
        pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar31 * -2 + 1) * 4);
        pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar25 + ((ulong)bVar31 * -2 + 1) * 4);
      }
      local_1b0.m_backend.exp = pnVar9[iVar16].m_backend.exp;
      local_1b0.m_backend.neg = pnVar9[iVar16].m_backend.neg;
      local_1b0.m_backend.fpclass = pnVar9[iVar16].m_backend.fpclass;
      local_1b0.m_backend.prec_elem = pnVar9[iVar16].m_backend.prec_elem;
      local_5c0 = 0x1c00000000;
      local_638 = 0;
      uStack_630 = 0;
      local_628 = 0;
      uStack_620 = 0;
      local_618 = 0;
      uStack_610 = 0;
      local_608 = 0;
      uStack_600 = 0;
      local_5f8 = 0;
      uStack_5f0 = 0;
      local_5e8 = 0;
      uStack_5e0 = 0;
      local_5d8 = 0;
      uStack_5d0 = 0;
      uStack_5cb = 0;
      uStack_5c8 = 0;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_638,0.0);
      feastol(&local_230,this);
      bVar15 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_1b0,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_638,&local_230);
      if (bVar15) {
        return INFEASIBLE;
      }
      iVar16 = *i;
      pnVar9 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar24 = pnVar9 + iVar16;
      puVar27 = local_798;
      for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
        *puVar27 = (pnVar24->m_backend).data._M_elems[0];
        pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar31 * -2 + 1) * 4);
        puVar27 = puVar27 + (ulong)bVar31 * -2 + 1;
      }
      uVar7 = pnVar9[iVar16].m_backend.fpclass;
      local_6b8.fpclass = cpp_dec_float_finite;
      local_6b8.prec_elem = 0x1c;
      local_6b8.data._M_elems[0] = 0;
      local_6b8.data._M_elems[1] = 0;
      local_6b8.data._M_elems[2] = 0;
      local_6b8.data._M_elems[3] = 0;
      local_6b8.data._M_elems[4] = 0;
      local_6b8.data._M_elems[5] = 0;
      local_6b8.data._M_elems[6] = 0;
      local_6b8.data._M_elems[7] = 0;
      local_6b8.data._M_elems[8] = 0;
      local_6b8.data._M_elems[9] = 0;
      local_6b8.data._M_elems[10] = 0;
      local_6b8.data._M_elems[0xb] = 0;
      local_6b8.data._M_elems[0xc] = 0;
      local_6b8.data._M_elems[0xd] = 0;
      local_6b8.data._M_elems[0xe] = 0;
      local_6b8.data._M_elems[0xf] = 0;
      local_6b8.data._M_elems[0x10] = 0;
      local_6b8.data._M_elems[0x11] = 0;
      local_6b8.data._M_elems[0x12] = 0;
      local_6b8.data._M_elems[0x13] = 0;
      local_6b8.data._M_elems[0x14] = 0;
      local_6b8.data._M_elems[0x15] = 0;
      local_6b8.data._M_elems[0x16] = 0;
      local_6b8.data._M_elems[0x17] = 0;
      local_6b8.data._M_elems[0x18] = 0;
      local_6b8.data._M_elems[0x19] = 0;
      local_6b8.data._M_elems._104_5_ = 0;
      local_6b8.data._M_elems[0x1b]._1_3_ = 0;
      local_6b8.exp = 0;
      local_6b8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_6b8,0.0);
      feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_d18,this);
      puVar27 = local_798;
      pcVar21 = (cpp_dec_float<200U,_int,_void> *)&ptr;
      for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
        (pcVar21->data)._M_elems[0] = *puVar27;
        puVar27 = puVar27 + (ulong)bVar31 * -2 + 1;
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar31 * -8 + 4);
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_6b8);
      if (((uVar7 != cpp_dec_float_NaN) && (local_d18.fpclass != cpp_dec_float_NaN)) &&
         (iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_d18), 0 < iVar16)) {
        return INFEASIBLE;
      }
      goto LAB_00569861;
    }
    pcVar21 = &(lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
    ::soplex::infinity::__tls_init();
    local_1098.fpclass = cpp_dec_float_finite;
    local_1098.prec_elem = 0x1c;
    local_1098.data._M_elems[0] = 0;
    local_1098.data._M_elems[1] = 0;
    local_1098.data._M_elems[2] = 0;
    local_1098.data._M_elems[3] = 0;
    local_1098.data._M_elems[4] = 0;
    local_1098.data._M_elems[5] = 0;
    local_1098.data._M_elems[6] = 0;
    local_1098.data._M_elems[7] = 0;
    local_1098.data._M_elems[8] = 0;
    local_1098.data._M_elems[9] = 0;
    local_1098.data._M_elems[10] = 0;
    local_1098.data._M_elems[0xb] = 0;
    local_1098.data._M_elems[0xc] = 0;
    local_1098.data._M_elems[0xd] = 0;
    local_1098.data._M_elems[0xe] = 0;
    local_1098.data._M_elems[0xf] = 0;
    local_1098.data._M_elems[0x10] = 0;
    local_1098.data._M_elems[0x11] = 0;
    local_1098.data._M_elems[0x12] = 0;
    local_1098.data._M_elems[0x13] = 0;
    local_1098.data._M_elems[0x14] = 0;
    local_1098.data._M_elems[0x15] = 0;
    local_1098.data._M_elems[0x16] = 0;
    local_1098.data._M_elems[0x17] = 0;
    local_1098.data._M_elems[0x18] = 0;
    local_1098.data._M_elems[0x19] = 0;
    local_1098.data._M_elems._104_5_ = 0;
    local_1098.data._M_elems[0x1b]._1_3_ = 0;
    local_1098.exp = 0;
    local_1098.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_1098,a);
    if (((pcVar21->fpclass == cpp_dec_float_NaN) || (local_1098.fpclass == cpp_dec_float_NaN)) ||
       (iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (pcVar21,&local_1098), iVar16 < 0)) {
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,
                 &(lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[*i].m_backend,&local_f18);
    }
    else {
      ::soplex::infinity::__tls_init();
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&ptr,a_00);
    }
    psVar20 = &ptr;
    puVar22 = &local_f98;
    for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
      *(undefined4 *)puVar22 =
           *(undefined4 *)
            &(psVar20->
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
      psVar20 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar20 + (ulong)bVar31 * -8 + 4);
      puVar22 = (undefined8 *)((long)puVar22 + (ulong)bVar31 * -8 + 4);
    }
    iStack_f28 = 0;
    cStack_f24 = '\0';
    local_f20._0_4_ = cpp_dec_float_finite;
    local_f20._4_4_ = 0x1c;
    pcVar21 = &(lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
    ::soplex::infinity::__tls_init();
    local_1098.fpclass = cpp_dec_float_finite;
    local_1098.prec_elem = 0x1c;
    local_1098.data._M_elems[0] = 0;
    local_1098.data._M_elems[1] = 0;
    local_1098.data._M_elems[2] = 0;
    local_1098.data._M_elems[3] = 0;
    local_1098.data._M_elems[4] = 0;
    local_1098.data._M_elems[5] = 0;
    local_1098.data._M_elems[6] = 0;
    local_1098.data._M_elems[7] = 0;
    local_1098.data._M_elems[8] = 0;
    local_1098.data._M_elems[9] = 0;
    local_1098.data._M_elems[10] = 0;
    local_1098.data._M_elems[0xb] = 0;
    local_1098.data._M_elems[0xc] = 0;
    local_1098.data._M_elems[0xd] = 0;
    local_1098.data._M_elems[0xe] = 0;
    local_1098.data._M_elems[0xf] = 0;
    local_1098.data._M_elems[0x10] = 0;
    local_1098.data._M_elems[0x11] = 0;
    local_1098.data._M_elems[0x12] = 0;
    local_1098.data._M_elems[0x13] = 0;
    local_1098.data._M_elems[0x14] = 0;
    local_1098.data._M_elems[0x15] = 0;
    local_1098.data._M_elems[0x16] = 0;
    local_1098.data._M_elems[0x17] = 0;
    local_1098.data._M_elems[0x18] = 0;
    local_1098.data._M_elems[0x19] = 0;
    local_1098.data._M_elems._104_5_ = 0;
    local_1098.data._M_elems[0x1b]._1_3_ = 0;
    local_1098.exp = 0;
    local_1098.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_1098,a_00);
    if (((pcVar21->fpclass == cpp_dec_float_NaN) || (local_1098.fpclass == cpp_dec_float_NaN)) ||
       (iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (pcVar21,&local_1098), 0 < iVar16)) {
      pcVar21 = &(lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
      goto LAB_005697ad;
    }
LAB_005697f5:
    ::soplex::infinity::__tls_init();
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&ptr,a);
  }
  else {
    pcVar21 = &(lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
    ::soplex::infinity::__tls_init();
    local_1098.fpclass = cpp_dec_float_finite;
    local_1098.prec_elem = 0x1c;
    local_1098.data._M_elems[0] = 0;
    local_1098.data._M_elems[1] = 0;
    local_1098.data._M_elems[2] = 0;
    local_1098.data._M_elems[3] = 0;
    local_1098.data._M_elems[4] = 0;
    local_1098.data._M_elems[5] = 0;
    local_1098.data._M_elems[6] = 0;
    local_1098.data._M_elems[7] = 0;
    local_1098.data._M_elems[8] = 0;
    local_1098.data._M_elems[9] = 0;
    local_1098.data._M_elems[10] = 0;
    local_1098.data._M_elems[0xb] = 0;
    local_1098.data._M_elems[0xc] = 0;
    local_1098.data._M_elems[0xd] = 0;
    local_1098.data._M_elems[0xe] = 0;
    local_1098.data._M_elems[0xf] = 0;
    local_1098.data._M_elems[0x10] = 0;
    local_1098.data._M_elems[0x11] = 0;
    local_1098.data._M_elems[0x12] = 0;
    local_1098.data._M_elems[0x13] = 0;
    local_1098.data._M_elems[0x14] = 0;
    local_1098.data._M_elems[0x15] = 0;
    local_1098.data._M_elems[0x16] = 0;
    local_1098.data._M_elems[0x17] = 0;
    local_1098.data._M_elems[0x18] = 0;
    local_1098.data._M_elems[0x19] = 0;
    local_1098.data._M_elems._104_5_ = 0;
    local_1098.data._M_elems[0x1b]._1_3_ = 0;
    local_1098.exp = 0;
    local_1098.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_1098,a_00);
    if (((pcVar21->fpclass == cpp_dec_float_NaN) || (local_1098.fpclass == cpp_dec_float_NaN)) ||
       (iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (pcVar21,&local_1098), 0 < iVar16)) {
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,
                 &(lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[*i].m_backend,&local_f18);
    }
    else {
      ::soplex::infinity::__tls_init();
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&ptr,a_00);
    }
    psVar20 = &ptr;
    puVar22 = &local_f98;
    for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
      *(undefined4 *)puVar22 =
           *(undefined4 *)
            &(psVar20->
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
      psVar20 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar20 + (ulong)bVar31 * -8 + 4);
      puVar22 = (undefined8 *)((long)puVar22 + (ulong)bVar31 * -8 + 4);
    }
    iStack_f28 = 0;
    cStack_f24 = '\0';
    local_f20._0_4_ = cpp_dec_float_finite;
    local_f20._4_4_ = 0x1c;
    pcVar21 = &(lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
    ::soplex::infinity::__tls_init();
    local_1098.fpclass = cpp_dec_float_finite;
    local_1098.prec_elem = 0x1c;
    local_1098.data._M_elems[0] = 0;
    local_1098.data._M_elems[1] = 0;
    local_1098.data._M_elems[2] = 0;
    local_1098.data._M_elems[3] = 0;
    local_1098.data._M_elems[4] = 0;
    local_1098.data._M_elems[5] = 0;
    local_1098.data._M_elems[6] = 0;
    local_1098.data._M_elems[7] = 0;
    local_1098.data._M_elems[8] = 0;
    local_1098.data._M_elems[9] = 0;
    local_1098.data._M_elems[10] = 0;
    local_1098.data._M_elems[0xb] = 0;
    local_1098.data._M_elems[0xc] = 0;
    local_1098.data._M_elems[0xd] = 0;
    local_1098.data._M_elems[0xe] = 0;
    local_1098.data._M_elems[0xf] = 0;
    local_1098.data._M_elems[0x10] = 0;
    local_1098.data._M_elems[0x11] = 0;
    local_1098.data._M_elems[0x12] = 0;
    local_1098.data._M_elems[0x13] = 0;
    local_1098.data._M_elems[0x14] = 0;
    local_1098.data._M_elems[0x15] = 0;
    local_1098.data._M_elems[0x16] = 0;
    local_1098.data._M_elems[0x17] = 0;
    local_1098.data._M_elems[0x18] = 0;
    local_1098.data._M_elems[0x19] = 0;
    local_1098.data._M_elems._104_5_ = 0;
    local_1098.data._M_elems[0x1b]._1_3_ = 0;
    local_1098.exp = 0;
    local_1098.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_1098,a);
    if (((pcVar21->fpclass != cpp_dec_float_NaN) && (local_1098.fpclass != cpp_dec_float_NaN)) &&
       (iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (pcVar21,&local_1098), -1 < iVar16)) goto LAB_005697f5;
    pcVar21 = &(lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
LAB_005697ad:
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)&ptr,pcVar21,&local_f18);
  }
  psVar20 = &ptr;
  puVar22 = &local_1018;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    *(undefined4 *)puVar22 =
         *(undefined4 *)
          &(psVar20->
           super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
    psVar20 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar20 + (ulong)bVar31 * -8 + 4);
    puVar22 = (undefined8 *)((long)puVar22 + (ulong)bVar31 * -8 + 4);
  }
  iStack_fa8 = 0;
  cStack_fa4 = '\0';
  local_fa0._0_4_ = cpp_dec_float_finite;
  local_fa0._4_4_ = 0x1c;
LAB_00569861:
  uVar13 = local_f20;
  puVar22 = &local_f98;
  puVar23 = local_808;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    *puVar23 = *(undefined4 *)puVar22;
    puVar22 = (undefined8 *)((long)puVar22 + (ulong)bVar31 * -8 + 4);
    puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
  }
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_d98,this);
  puVar23 = local_808;
  psVar20 = &ptr;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    *(undefined4 *)
     &(psVar20->
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = *puVar23;
    puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
    psVar20 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar20 + (ulong)bVar31 * -8 + 4);
  }
  local_1178 = (fpclass_type)uVar13;
  if (((local_1178 != cpp_dec_float_NaN) && (local_d98.fpclass != cpp_dec_float_NaN)) &&
     (iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_d98), iVar16 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_f98,0.0);
  }
  uVar13 = local_fa0;
  puVar22 = &local_1018;
  puVar23 = local_878;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    *puVar23 = *(undefined4 *)puVar22;
    puVar22 = (undefined8 *)((long)puVar22 + (ulong)bVar31 * -8 + 4);
    puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
  }
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_e18,this);
  puVar23 = local_878;
  psVar20 = &ptr;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    *(undefined4 *)
     &(psVar20->
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = *puVar23;
    puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
    psVar20 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar20 + (ulong)bVar31 * -8 + 4);
  }
  local_1178 = (fpclass_type)uVar13;
  if (((local_1178 != cpp_dec_float_NaN) && (local_e18.fpclass != cpp_dec_float_NaN)) &&
     (iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_e18), iVar16 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_1018,0.0);
  }
  uVar13 = local_fa0;
  cVar12 = cStack_fa4;
  iVar16 = iStack_fa8;
  pnVar9 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar24 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).up.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pnVar26 = pnVar9 + lVar17;
  puVar27 = local_968;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    *puVar27 = (pnVar26->m_backend).data._M_elems[0];
    pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar31 * -2 + 1) * 4);
    puVar27 = puVar27 + (ulong)bVar31 * -2 + 1;
  }
  iVar2 = pnVar9[lVar17].m_backend.exp;
  bVar15 = pnVar9[lVar17].m_backend.neg;
  pnVar26 = pnVar24 + lVar17;
  puVar27 = local_9d8;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    *puVar27 = (pnVar26->m_backend).data._M_elems[0];
    pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar31 * -2 + 1) * 4);
    puVar27 = puVar27 + (ulong)bVar31 * -2 + 1;
  }
  iVar3 = pnVar24[lVar17].m_backend.exp;
  bVar1 = pnVar24[lVar17].m_backend.neg;
  fVar4 = pnVar24[lVar17].m_backend.fpclass;
  iVar5 = pnVar24[lVar17].m_backend.prec_elem;
  puVar27 = (uint *)&local_1018;
  puVar29 = local_a48;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    *puVar29 = *puVar27;
    puVar27 = puVar27 + (ulong)bVar31 * -2 + 1;
    puVar29 = puVar29 + (ulong)bVar31 * -2 + 1;
  }
  pnVar24 = pnVar24 + lVar17;
  puVar27 = local_ab8;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    *puVar27 = (pnVar24->m_backend).data._M_elems[0];
    pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar31 * -2 + 1) * 4);
    puVar27 = puVar27 + (ulong)bVar31 * -2 + 1;
  }
  feastol(&local_2b0,this);
  puVar27 = local_a48;
  pcVar21 = &local_1098;
  for (lVar18 = 0x1c; uVar10 = local_fa0, lVar18 != 0; lVar18 = lVar18 + -1) {
    (pcVar21->data)._M_elems[0] = *puVar27;
    puVar27 = puVar27 + (ulong)bVar31 * -2 + 1;
    pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar31 * -8 + 4);
  }
  local_1098.exp = iVar16;
  local_1098.neg = (bool)cVar12;
  local_fa0._0_4_ = (fpclass_type)uVar13;
  local_fa0._4_4_ = SUB84(uVar13,4);
  local_1098.fpclass = (fpclass_type)local_fa0;
  local_1098.prec_elem = local_fa0._4_4_;
  puVar27 = local_ab8;
  pnVar25 = &local_8f8;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    (pnVar25->m_backend).data._M_elems[0] = *puVar27;
    puVar27 = puVar27 + (ulong)bVar31 * -2 + 1;
    pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar25 + ((ulong)bVar31 * -2 + 1) * 4);
  }
  local_8f8.m_backend.prec_elem = iVar5;
  local_8f8.m_backend.fpclass = fVar4;
  local_fa0 = uVar10;
  local_8f8.m_backend.exp = iVar3;
  local_8f8.m_backend.neg = bVar1;
  relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&ptr,(soplex *)&local_1098,&local_8f8,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)0x0);
  pnVar25 = &local_2b0;
  pnVar28 = &result_6;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    (pnVar28->m_backend).data._M_elems[0] = (pnVar25->m_backend).data._M_elems[0];
    pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar25 + ((ulong)bVar31 * -2 + 1) * 4);
    pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar28 + ((ulong)bVar31 * -2 + 1) * 4);
  }
  result_6.m_backend.exp = local_2b0.m_backend.exp;
  result_6.m_backend.neg = local_2b0.m_backend.neg;
  result_6.m_backend.fpclass = local_2b0.m_backend.fpclass;
  result_6.m_backend.prec_elem = local_2b0.m_backend.prec_elem;
  if (result_6.m_backend.data._M_elems[0] != 0 ||
      local_2b0.m_backend.fpclass != cpp_dec_float_finite) {
    result_6.m_backend.neg = (bool)(local_2b0.m_backend.neg ^ 1);
  }
  if ((local_2b0.m_backend.fpclass == cpp_dec_float_NaN) || (local_1178 == cpp_dec_float_NaN)) {
    local_1180 = false;
  }
  else {
    iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       ((cpp_dec_float<200U,_int,_void> *)&ptr,&result_6.m_backend);
    if (iVar16 < 1) {
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x2d])(lp,lVar17,&local_1018,0);
      local_1180 = true;
    }
    else {
      local_1180 = false;
    }
  }
  uVar13 = local_f20;
  cVar12 = cStack_f24;
  iVar16 = iStack_f28;
  puVar27 = (uint *)&local_f98;
  puVar29 = local_b28;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    *puVar29 = *puVar27;
    puVar27 = puVar27 + (ulong)bVar31 * -2 + 1;
    puVar29 = puVar29 + (ulong)bVar31 * -2 + 1;
  }
  pnVar24 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).low.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pnVar26 = pnVar24 + lVar17;
  puVar27 = local_b98;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    *puVar27 = (pnVar26->m_backend).data._M_elems[0];
    pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar31 * -2 + 1) * 4);
    puVar27 = puVar27 + (ulong)bVar31 * -2 + 1;
  }
  iVar6 = pnVar24[lVar17].m_backend.exp;
  bVar30 = pnVar24[lVar17].m_backend.neg;
  uVar10._0_4_ = pnVar24[lVar17].m_backend.fpclass;
  uVar10._4_4_ = pnVar24[lVar17].m_backend.prec_elem;
  feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_e98,this);
  puVar27 = local_b28;
  pcVar21 = &local_1098;
  for (lVar18 = 0x1c; uVar14 = local_f20, lVar18 != 0; lVar18 = lVar18 + -1) {
    (pcVar21->data)._M_elems[0] = *puVar27;
    puVar27 = puVar27 + (ulong)bVar31 * -2 + 1;
    pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar31 * -8 + 4);
  }
  local_1098.exp = iVar16;
  local_1098.neg = (bool)cVar12;
  local_f20._0_4_ = (fpclass_type)uVar13;
  local_f20._4_4_ = SUB84(uVar13,4);
  local_1098.fpclass = (fpclass_type)local_f20;
  local_1098.prec_elem = local_f20._4_4_;
  puVar27 = local_b98;
  pnVar25 = &local_8f8;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    (pnVar25->m_backend).data._M_elems[0] = *puVar27;
    puVar27 = puVar27 + (ulong)bVar31 * -2 + 1;
    pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar25 + ((ulong)bVar31 * -2 + 1) * 4);
  }
  local_f20 = uVar14;
  local_8f8.m_backend.exp = iVar6;
  local_8f8.m_backend.neg = bVar30;
  local_8f8.m_backend._120_8_ = uVar10;
  relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&ptr,(soplex *)&local_1098,&local_8f8,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)0x0);
  if (((local_1178 == cpp_dec_float_NaN) || (local_e98.fpclass == cpp_dec_float_NaN)) ||
     (iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_e98), iVar16 < 1)) {
    bVar30 = false;
  }
  else {
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2a])(lp,lVar17,&local_f98,0);
    bVar30 = true;
  }
  this_00 = (RowSingletonPS *)operator_new(0x458);
  iVar16 = *i;
  pnVar24 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).low.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pnVar26 = pnVar24 + lVar17;
  pnVar25 = &local_330;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
    pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar31 * -2 + 1) * 4);
    pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar25 + ((ulong)bVar31 * -2 + 1) * 4);
  }
  local_330.m_backend.exp = pnVar24[lVar17].m_backend.exp;
  local_330.m_backend.neg = pnVar24[lVar17].m_backend.neg;
  local_330.m_backend.fpclass = pnVar24[lVar17].m_backend.fpclass;
  local_330.m_backend.prec_elem = pnVar24[lVar17].m_backend.prec_elem;
  pnVar24 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).up.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pnVar26 = pnVar24 + lVar17;
  pnVar25 = &local_3b0;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    (pnVar25->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
    pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar31 * -2 + 1) * 4);
    pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar25 + ((ulong)bVar31 * -2 + 1) * 4);
  }
  local_3b0.m_backend.exp = pnVar24[lVar17].m_backend.exp;
  local_3b0.m_backend.neg = pnVar24[lVar17].m_backend.neg;
  local_3b0.m_backend.fpclass = pnVar24[lVar17].m_backend.fpclass;
  local_3b0.m_backend.prec_elem = pnVar24[lVar17].m_backend.prec_elem;
  puVar27 = local_968;
  pnVar25 = &local_430;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    (pnVar25->m_backend).data._M_elems[0] = *puVar27;
    puVar27 = puVar27 + (ulong)bVar31 * -2 + 1;
    pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar25 + ((ulong)bVar31 * -2 + 1) * 4);
  }
  local_430.m_backend.exp = iVar2;
  local_430.m_backend.neg = bVar15;
  local_430.m_backend.fpclass = pnVar9[lVar17].m_backend.fpclass;
  local_430.m_backend.prec_elem = pnVar9[lVar17].m_backend.prec_elem;
  puVar27 = local_9d8;
  pnVar25 = &local_4b0;
  for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
    (pnVar25->m_backend).data._M_elems[0] = *puVar27;
    puVar27 = puVar27 + (ulong)bVar31 * -2 + 1;
    pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar25 + ((ulong)bVar31 * -2 + 1) * 4);
  }
  local_1138.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1138.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_1138.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1138.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1138.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1138.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1138.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_4b0.m_backend.exp = iVar3;
  local_4b0.m_backend.neg = bVar1;
  local_4b0.m_backend.fpclass = fVar4;
  local_4b0.m_backend.prec_elem = iVar5;
  RowSingletonPS::RowSingletonPS
            (this_00,lp,iVar16,_j,bVar30,local_1180,&local_330,&local_3b0,&local_430,&local_4b0,
             &local_1138);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::RowSingletonPS*>
            (&ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_00);
  if (local_1138.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1138.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::push_back(&(this->m_hist).data,&ptr);
  piVar11 = (this->m_rIdx).data;
  piVar11[*i] = piVar11[(long)(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum + -1];
  (*(lp->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0xf])(lp);
  piVar11 = &(this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_remRows;
  *piVar11 = *piVar11 + 1;
  piVar11 = &(this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_remNzos;
  *piVar11 = *piVar11 + 1;
  piVar11 = (this->m_stat).data + 2;
  *piVar11 = *piVar11 + 1;
  if (ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::removeRowSingleton(SPxLPBase<R>& lp,
      const SVectorBase<R>& row, int& i)
{
   assert(row.size() == 1);

   R aij = row.value(0);
   int  j   = row.index(0);
   R lo  = R(-infinity);
   R up  =  R(infinity);

   SPxOut::debug(this, "IMAISM22 row {}: singleton -> val={} lhs={} rhs={}", i, aij, lp.lhs(i),
                 lp.rhs(i));

   if(GT(aij, R(0.0), this->epsZero()))            // aij > 0
   {
      lo = (lp.lhs(i) <= R(-infinity)) ? R(-infinity) : lp.lhs(i) / aij;
      up = (lp.rhs(i) >=  R(infinity)) ?  R(infinity) : lp.rhs(i) / aij;
   }
   else if(LT(aij, R(0.0), this->epsZero()))       // aij < 0
   {
      lo = (lp.rhs(i) >=  R(infinity)) ? R(-infinity) : lp.rhs(i) / aij;
      up = (lp.lhs(i) <= R(-infinity)) ?  R(infinity) : lp.lhs(i) / aij;
   }
   else if(LT(lp.rhs(i), R(0.0), feastol()) || GT(lp.lhs(i), R(0.0), feastol()))
   {
      // aij == 0, rhs < 0 or lhs > 0
      SPxOut::debug(this, " infeasible\n");
      return this->INFEASIBLE;
   }

   if(isZero(lo, this->epsZero()))
      lo = 0.0;

   if(isZero(up, this->epsZero()))
      up = 0.0;

   SPxOut::debug(this, " removed, lower={} ({}) upper={} ({})\n", lo, lp.lower(j), up, lp.upper(j));

   bool stricterUp = false;
   bool stricterLo = false;

   R oldLo = lp.lower(j);
   R oldUp = lp.upper(j);

   if(LTrel(up, lp.upper(j), feastol()))
   {
      lp.changeUpper(j, up);
      stricterUp = true;
   }

   if(GTrel(lo, lp.lower(j), feastol()))
   {
      lp.changeLower(j, lo);
      stricterLo = true;
   }

   std::shared_ptr<PostStep> ptr(new RowSingletonPS(lp, i, j, stricterLo, stricterUp,
                                 lp.lower(j),
                                 lp.upper(j), oldLo, oldUp, this->_tolerances));
   m_hist.append(ptr);

   removeRow(lp, i);

   this->m_remRows++;
   this->m_remNzos++;
   ++m_stat[SINGLETON_ROW];

   return this->OKAY;
}